

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

gs_val_t *
gs_c_fn_vec2_bezier4(gs_val_t *__return_storage_ptr__,gs_eval_t *eval,gs_val_t *vals,int num_vals)

{
  vec2 v;
  undefined1 local_58 [8];
  gs_val_t sig;
  gs_val_type gStack_38;
  int signature_arg_count;
  gs_val_type signature_arg_types [5];
  int num_vals_local;
  gs_val_t *vals_local;
  gs_eval_t *eval_local;
  
  _gStack_38 = 0x400000004;
  signature_arg_types[0] = GS_VAL_VEC2;
  signature_arg_types[1] = GS_VAL_VEC2;
  signature_arg_types[2] = GS_VAL_FLOAT;
  sig.field_2._12_4_ = 5;
  gs_c_fn_signature((gs_val_t *)local_58,eval,vals,num_vals,&gStack_38,5);
  if ((local_58._4_4_ & 1) == 0) {
    v = vec2_bezier((vals->field_2).vec2_val,vals[1].field_2.vec2_val,vals[2].field_2.vec2_val,
                    vals[3].field_2.vec2_val,vals[4].field_2.float_val);
    gs_val_vec2(__return_storage_ptr__,v);
  }
  else {
    __return_storage_ptr__->type = local_58._0_4_;
    __return_storage_ptr__->is_return = (_Bool)(char)local_58._4_4_;
    *(int3 *)&__return_storage_ptr__->field_0x5 = SUB43(local_58._4_4_,1);
    (__return_storage_ptr__->field_2).vec2_val = (vec2)sig._0_8_;
    *(vec2 *)((long)&__return_storage_ptr__->field_2 + 8) = sig.field_2.vec2_val;
  }
  return __return_storage_ptr__;
}

Assistant:

static gs_val_t gs_c_fn_vec2_bezier4(gs_eval_t *eval, gs_val_t *vals, int num_vals) {
    gs_val_type signature_arg_types[] = { GS_VAL_VEC2, GS_VAL_VEC2, GS_VAL_VEC2, GS_VAL_VEC2, GS_VAL_FLOAT };
    int signature_arg_count = sizeof(signature_arg_types) / sizeof(signature_arg_types[0]);
    gs_val_t sig = gs_c_fn_signature(eval, vals, num_vals, signature_arg_types, signature_arg_count);
    if (sig.is_return) return sig;

    return gs_val_vec2(vec2_bezier(vals[0].vec2_val, vals[1].vec2_val, vals[2].vec2_val, vals[3].vec2_val, vals[4].float_val));
}